

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O3

void verify_horizontal_left(Board *board,int row,int col,Ship *ship)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)ship->length + -1;
  if ((int)lVar2 <= col) {
    iVar1 = std::__cxx11::string::compare
                      ((char *)((col - lVar2) * 0x20 +
                               *(long *)&(board->matrix).
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[row].
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data));
    if (iVar1 == 0) {
      iVar1 = ship->length;
      if (iVar1 <= col) {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)(col - iVar1) * 0x20 +
                                   *(long *)&(board->matrix).
                                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[row].
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data));
        if (iVar1 == 0) {
          ship->sRow = row;
          ship->sCol = col;
          goto LAB_00102ab7;
        }
        iVar1 = ship->length;
      }
      ship->sRow = row;
      ship->sCol = col;
      if (col < iVar1) {
LAB_00102ab7:
        ship->orientation = 'H';
        ship->direction = -1;
        return;
      }
      goto LAB_00102a59;
    }
  }
  ship->sRow = row;
  ship->sCol = col;
LAB_00102a59:
  ship->orientation = 'N';
  ship->direction = 0;
  return;
}

Assistant:

void verify_horizontal_left( Board *board, int row, int col, Ship *ship )
{
	/*! Checks if the current position plus the rest of the ship exceeds
	 *  the inferior border or touches another ship
	 */
    if( ( col - ( ship->length - 1 ) >= 0) and ( board->matrix[row][col - ( ship->length - 1 )] == "~" ) )
	{
        if( ( col - ship->length >= 0 ) and ( board->matrix[row][col - ship->length] == "~" ) )
        {
            ship->set_values( row, col, 'H', -1 );
        }
        else if( col - ship->length < 0 )
        {
            ship->set_values( row, col, 'H', -1 );
        }
        else
        {
            ship->set_values( row, col, 'N', 0 );
        }
    }
    else
    {
        ship->set_values( row, col, 'N', 0 );
    }
}